

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(Registry *this,uint64_t aXpan)

{
  Status SVar1;
  Network nwk;
  Network local_80;
  
  Network::Network(&local_80);
  SVar1 = GetNetworkByXpan(this,aXpan,&local_80);
  if (SVar1 == kSuccess) {
    SVar1 = SetCurrentNetwork(this,&local_80.mId);
  }
  Network::~Network(&local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::SetCurrentNetwork(uint64_t aXpan)
{
    Network          nwk;
    Registry::Status status;

    VerifyOrExit((status = GetNetworkByXpan(aXpan, nwk)) == Registry::Status::kSuccess);
    status = SetCurrentNetwork(nwk.mId);
exit:
    return status;
}